

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize,
          function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *object)

{
  _Invoker_type p_Var1;
  _Any_data *p_Var2;
  int64_t *piVar3;
  long lVar4;
  long lVar5;
  _Any_data *p_Var6;
  long lVar7;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar8;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *__s;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      __s = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0;
    }
    else {
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar3 = newsize;
      __s = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)(piVar3 + 1);
      memset(__s,0,newsize << 5);
    }
    if (newsize <= lVar5) {
      lVar5 = newsize;
    }
    if (lVar5 < 1) {
      lVar7 = 0;
    }
    else {
      lVar4 = 0;
      lVar7 = 0;
      do {
        std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                  ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                   ((long)&(__s->super__Function_base)._M_functor + lVar4),
                   (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                   ((long)&(this->fStore->super__Function_base)._M_functor + lVar4));
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar5 != lVar7);
    }
    lVar5 = newsize - lVar7;
    if (lVar5 != 0 && lVar7 <= newsize) {
      pfVar8 = __s + lVar7;
      do {
        std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=(pfVar8,object);
        pfVar8 = pfVar8 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pfVar8 = this->fStore;
    if (pfVar8 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
      p_Var1 = pfVar8[-1]._M_invoker;
      if (p_Var1 != (_Invoker_type)0x0) {
        lVar5 = (long)p_Var1 * -0x20;
        p_Var2 = (_Any_data *)(pfVar8 + (long)p_Var1);
        do {
          p_Var6 = p_Var2 + -2;
          if (*(code **)(p_Var2 + -1) != (code *)0x0) {
            (**(code **)(p_Var2 + -1))(p_Var6,p_Var6,__destroy_functor);
          }
          lVar5 = lVar5 + 0x20;
          p_Var2 = p_Var6;
        } while (lVar5 != 0);
      }
      operator_delete__(&pfVar8[-1]._M_invoker,(long)p_Var1 << 5 | 8);
      this->fStore = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0;
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}